

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_gui.c
# Opt level: O2

void x_gui_setup(void)

{
  undefined8 in_RAX;
  t_symbol *ptVar1;
  _class *p_Var2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("gfxstub");
  gfxstub_class = class_new(ptVar1,(t_newmethod)0x0,gfxstub_free,0x28,1,A_NULL);
  class_addanything(gfxstub_class,gfxstub_anything);
  p_Var2 = gfxstub_class;
  ptVar1 = gensym("signoff");
  class_addmethod(p_Var2,gfxstub_signoff,ptVar1,A_NULL);
  p_Var2 = gfxstub_class;
  ptVar1 = gensym("data");
  class_addmethod(p_Var2,gfxstub_data,ptVar1,A_GIMME);
  p_Var2 = gfxstub_class;
  ptVar1 = gensym("end");
  class_addmethod(p_Var2,gfxstub_end,ptVar1,A_NULL);
  p_Var2 = gfxstub_class;
  ptVar1 = gensym("cancel");
  class_addmethod(p_Var2,gfxstub_cancel,ptVar1,A_NULL);
  ptVar1 = gensym("openpanel");
  openpanel_class =
       class_new(ptVar1,openpanel_new,openpanel_free,0x40,0,A_DEFFLOAT,(ulong)uVar3 << 0x20);
  class_addbang(openpanel_class,openpanel_bang);
  class_addsymbol(openpanel_class,openpanel_symbol);
  p_Var2 = openpanel_class;
  ptVar1 = gensym("callback");
  class_addmethod(p_Var2,openpanel_callback,ptVar1,A_GIMME);
  ptVar1 = gensym("savepanel");
  savepanel_class = class_new(ptVar1,savepanel_new,savepanel_free,0x40,0,A_NULL);
  class_addbang(savepanel_class,savepanel_bang);
  class_addsymbol(savepanel_class,savepanel_symbol);
  p_Var2 = savepanel_class;
  ptVar1 = gensym("callback");
  class_addmethod(p_Var2,savepanel_callback,ptVar1,A_SYMBOL,0);
  ptVar1 = gensym("key");
  key_class = class_new(ptVar1,key_new,key_free,0x30,8,A_NULL);
  class_doaddfloat(key_class,key_float);
  p_Var2 = key_class;
  ptVar1 = gensym("key-input");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("keyup");
  keyup_class = class_new(ptVar1,keyup_new,keyup_free,0x30,8,A_NULL);
  class_doaddfloat(keyup_class,keyup_float);
  p_Var2 = keyup_class;
  ptVar1 = gensym("key-input");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("keyname");
  keyname_class = class_new(ptVar1,keyname_new,keyname_free,0x40,8,A_NULL);
  class_addlist(keyname_class,keyname_list);
  p_Var2 = keyname_class;
  ptVar1 = gensym("key-input");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("pdcontrol");
  p_Var2 = class_new(ptVar1,pdcontrol_new,(t_method)0x0,0x40,0,A_NULL);
  pdcontrol_class = p_Var2;
  ptVar1 = gensym("dir");
  class_addmethod(p_Var2,pdcontrol_dir,ptVar1,A_DEFFLOAT,7,0);
  p_Var2 = pdcontrol_class;
  ptVar1 = gensym("args");
  class_addmethod(p_Var2,pdcontrol_args,ptVar1,A_DEFFLOAT,0);
  p_Var2 = pdcontrol_class;
  ptVar1 = gensym("browse");
  class_addmethod(p_Var2,pdcontrol_browse,ptVar1,A_SYMBOL,0);
  p_Var2 = pdcontrol_class;
  ptVar1 = gensym("isvisible");
  class_addmethod(p_Var2,pdcontrol_isvisible,ptVar1,A_NULL);
  return;
}

Assistant:

static void gfxstub_setup(void)
{
    gfxstub_class = class_new(gensym("gfxstub"), 0, (t_method)gfxstub_free,
        sizeof(t_gfxstub), CLASS_PD, 0);
    class_addanything(gfxstub_class, gfxstub_anything);
    class_addmethod(gfxstub_class, (t_method)gfxstub_signoff,
        gensym("signoff"), 0);
    class_addmethod(gfxstub_class, (t_method)gfxstub_data,
        gensym("data"), A_GIMME, 0);
    class_addmethod(gfxstub_class, (t_method)gfxstub_end,
        gensym("end"), 0);
    class_addmethod(gfxstub_class, (t_method)gfxstub_cancel,
        gensym("cancel"), 0);
}